

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  BCWriteCtx *ctx;
  void *ud_local;
  lua_CFunction dummy_local;
  lua_State *L_local;
  
  if ((uint)((int)*(undefined8 *)((long)ud + 8) - (int)*(undefined8 *)((long)ud + 0x10)) < 0x400) {
    lj_buf_need2((SBuf *)ud,0x400);
  }
  bcwrite_header((BCWriteCtx *)ud);
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x20));
  bcwrite_footer((BCWriteCtx *)ud);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(L); UNUSED(dummy);
  lj_buf_need(&ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}